

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cc
# Opt level: O2

string * __thiscall
dh::symTab::get_in_function_abi_cxx11_(string *__return_storage_ptr__,symTab *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->in_function);
  return __return_storage_ptr__;
}

Assistant:

::std::string symTab::get_in_function() const
{
	return this->in_function;
}